

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O2

int Kit_DsdShrink_rec(Kit_DsdNtk_t *pNew,Kit_DsdNtk_t *p,int iLit,int *pPrios)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Kit_DsdObj_t *pKVar5;
  Kit_DsdObj_t *pKVar6;
  Kit_DsdObj_t KVar7;
  uint *puVar8;
  uint *pIn;
  uint *pOut;
  ulong uVar9;
  uint uSupps [16];
  uint piLitsNew [16];
  
  iVar2 = Abc_Lit2Var(iLit);
  pKVar5 = Kit_DsdNtkObj(p,iVar2);
  if (pKVar5 == (Kit_DsdObj_t *)0x0) {
    return iLit;
  }
  KVar7 = *pKVar5;
  uVar3 = (uint)KVar7 >> 6 & 7;
  if (uVar3 == 3) {
    for (uVar9 = 0; uVar9 < (uint)KVar7 >> 0x1a; uVar9 = uVar9 + 1) {
      uVar3 = Kit_DsdLitSupport(p,(uint)*(ushort *)(&pKVar5[1].field_0x0 + uVar9 * 2));
      uSupps[uVar9] = uVar3;
      KVar7 = *pKVar5;
    }
    Kit_DsdCompSort(pPrios,uSupps,(unsigned_short *)(pKVar5 + 1),(uint)KVar7 >> 0x1a,piLitsNew);
    iVar2 = Kit_DsdShrink_rec(pNew,p,piLitsNew[0],pPrios);
    pKVar6 = (Kit_DsdObj_t *)0x0;
    for (uVar9 = 1; uVar9 < (uint)*pKVar5 >> 0x1a; uVar9 = uVar9 + 1) {
      pKVar6 = Kit_DsdObjAlloc(pNew,KIT_DSD_AND,2);
      iVar4 = Kit_DsdShrink_rec(pNew,p,piLitsNew[uVar9],pPrios);
      *(short *)(pKVar6 + 1) = (short)iVar4;
      *(short *)&pKVar6[1].field_0x2 = (short)iVar2;
      iVar2 = Abc_Var2Lit((uint)*pKVar6 & 0x3f,0);
    }
  }
  else {
    if (uVar3 == 5) {
      pKVar6 = Kit_DsdObjAlloc(pNew,KIT_DSD_PRIME,(uint)KVar7 >> 0x1a);
      KVar7 = *pKVar5;
      puVar8 = (uint *)0x0;
      pIn = (uint *)(&pKVar5[1].field_0x0 + ((uint)KVar7 >> 8 & 0x3fc));
      if (((uint)KVar7 & 0x1c0) != 0x140) {
        pIn = puVar8;
      }
      pOut = (uint *)(&pKVar6[1].field_0x0 + ((uint)*pKVar6 >> 8 & 0x3fc));
      if (((uint)*pKVar6 & 0x1c0) != 0x140) {
        pOut = puVar8;
      }
      Kit_TruthCopy(pOut,pIn,(uint)KVar7 >> 0x1a);
      for (; puVar8 < (uint *)(ulong)((uint)*pKVar5 >> 0x1a); puVar8 = (uint *)((long)puVar8 + 1)) {
        uVar3 = Kit_DsdShrink_rec(pNew,p,(uint)*(ushort *)(&pKVar5[1].field_0x0 + (long)puVar8 * 2),
                                  pPrios);
        *(short *)(&pKVar6[1].field_0x0 + (long)puVar8 * 2) = (short)uVar3;
        iVar2 = Abc_LitIsCompl(uVar3 & 0xffff);
        if (iVar2 != 0) {
          iVar2 = Abc_LitRegular((uint)*(ushort *)(&pKVar6[1].field_0x0 + (long)puVar8 * 2));
          *(short *)(&pKVar6[1].field_0x0 + (long)puVar8 * 2) = (short)iVar2;
          Kit_TruthChangePhase(pOut,(uint)*pKVar6 >> 0x1a,(int)puVar8);
        }
      }
      iVar2 = Abc_LitIsCompl(iLit);
      if (iVar2 != 0) {
        Kit_TruthNot(pOut,pOut,(uint)*pKVar5 >> 0x1a);
      }
      KVar7 = *pKVar6;
      iVar2 = 0;
      goto LAB_004ca6c4;
    }
    if (uVar3 != 4) {
      __assert_fail("pObj->Type == KIT_DSD_PRIME",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                    ,0x63d,"int Kit_DsdShrink_rec(Kit_DsdNtk_t *, Kit_DsdNtk_t *, int, int *)");
    }
    for (uVar9 = 0; uVar9 < (uint)KVar7 >> 0x1a; uVar9 = uVar9 + 1) {
      uVar1 = *(ushort *)(&pKVar5[1].field_0x0 + uVar9 * 2);
      iVar2 = Abc_LitIsCompl((uint)uVar1);
      if (iVar2 != 0) {
        __assert_fail("!Abc_LitIsCompl(iLitFanin)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                      ,0x62c,"int Kit_DsdShrink_rec(Kit_DsdNtk_t *, Kit_DsdNtk_t *, int, int *)");
      }
      uVar3 = Kit_DsdLitSupport(p,(uint)uVar1);
      uSupps[uVar9] = uVar3;
      KVar7 = *pKVar5;
    }
    Kit_DsdCompSort(pPrios,uSupps,(unsigned_short *)(pKVar5 + 1),(uint)KVar7 >> 0x1a,piLitsNew);
    iVar2 = Kit_DsdShrink_rec(pNew,p,piLitsNew[0],pPrios);
    pKVar6 = (Kit_DsdObj_t *)0x0;
    for (uVar9 = 1; uVar9 < (uint)*pKVar5 >> 0x1a; uVar9 = uVar9 + 1) {
      pKVar6 = Kit_DsdObjAlloc(pNew,KIT_DSD_XOR,2);
      iVar4 = Kit_DsdShrink_rec(pNew,p,piLitsNew[uVar9],pPrios);
      *(short *)(pKVar6 + 1) = (short)iVar4;
      *(short *)&pKVar6[1].field_0x2 = (short)iVar2;
      iVar2 = Abc_Var2Lit((uint)*pKVar6 & 0x3f,0);
    }
  }
  KVar7 = *pKVar6;
  iVar2 = Abc_LitIsCompl(iLit);
LAB_004ca6c4:
  iVar2 = Abc_Var2Lit((uint)KVar7 & 0x3f,iVar2);
  return iVar2;
}

Assistant:

int Kit_DsdShrink_rec( Kit_DsdNtk_t * pNew, Kit_DsdNtk_t * p, int iLit, int pPrios[] )
{
    Kit_DsdObj_t * pObj;
    Kit_DsdObj_t * pObjNew = NULL; // Suppress "might be used uninitialized"
    unsigned * pTruth, * pTruthNew;
    unsigned i, piLitsNew[16], uSupps[16];
    int iLitFanin, iLitNew;

    // consider the case of simple gate
    pObj = Kit_DsdNtkObj( p, Abc_Lit2Var(iLit) );
    if ( pObj == NULL )
        return iLit;
    if ( pObj->Type == KIT_DSD_AND )
    {
        // get the supports
        Kit_DsdObjForEachFanin( p, pObj, iLitFanin, i )
            uSupps[i] = Kit_DsdLitSupport( p, iLitFanin );
        // put the largest component last
        // sort other components in the decreasing order of priority of their vars
        Kit_DsdCompSort( pPrios, uSupps, pObj->pFans, pObj->nFans, piLitsNew );
        // construct the two-input node network
        iLitNew = Kit_DsdShrink_rec( pNew, p, piLitsNew[0], pPrios );
        for ( i = 1; i < pObj->nFans; i++ )
        {
            pObjNew = Kit_DsdObjAlloc( pNew, KIT_DSD_AND, 2 );
            pObjNew->pFans[0] = Kit_DsdShrink_rec( pNew, p, piLitsNew[i], pPrios );
            pObjNew->pFans[1] = iLitNew;
            iLitNew = Abc_Var2Lit( pObjNew->Id, 0 );
        }
        return Abc_Var2Lit( pObjNew->Id, Abc_LitIsCompl(iLit) );
    }
    if ( pObj->Type == KIT_DSD_XOR )
    {
        // get the supports
        Kit_DsdObjForEachFanin( p, pObj, iLitFanin, i )
        {
            assert( !Abc_LitIsCompl(iLitFanin) );
            uSupps[i] = Kit_DsdLitSupport( p, iLitFanin );
        }
        // put the largest component last
        // sort other components in the decreasing order of priority of their vars
        Kit_DsdCompSort( pPrios, uSupps, pObj->pFans, pObj->nFans, piLitsNew );
        // construct the two-input node network
        iLitNew = Kit_DsdShrink_rec( pNew, p, piLitsNew[0], pPrios );
        for ( i = 1; i < pObj->nFans; i++ )
        {
            pObjNew = Kit_DsdObjAlloc( pNew, KIT_DSD_XOR, 2 );
            pObjNew->pFans[0] = Kit_DsdShrink_rec( pNew, p, piLitsNew[i], pPrios );
            pObjNew->pFans[1] = iLitNew;
            iLitNew = Abc_Var2Lit( pObjNew->Id, 0 );
        }
        return Abc_Var2Lit( pObjNew->Id, Abc_LitIsCompl(iLit) );
    }
    assert( pObj->Type == KIT_DSD_PRIME );

    // create new PRIME node
    pObjNew = Kit_DsdObjAlloc( pNew, KIT_DSD_PRIME, pObj->nFans );
    // copy the truth table
    pTruth = Kit_DsdObjTruth( pObj );
    pTruthNew = Kit_DsdObjTruth( pObjNew );
    Kit_TruthCopy( pTruthNew, pTruth, pObj->nFans );
    // create fanins
    Kit_DsdObjForEachFanin( pNtk, pObj, iLitFanin, i )
    {
        pObjNew->pFans[i] = Kit_DsdShrink_rec( pNew, p, iLitFanin, pPrios );
        // complement the corresponding inputs of the truth table
        if ( Abc_LitIsCompl(pObjNew->pFans[i]) )
        {
            pObjNew->pFans[i] = Abc_LitRegular(pObjNew->pFans[i]);
            Kit_TruthChangePhase( pTruthNew, pObjNew->nFans, i );
        }
    }
    // if the incoming phase is complemented, absorb it into the prime node
    if ( Abc_LitIsCompl(iLit) )
        Kit_TruthNot( pTruthNew, pTruthNew, pObj->nFans );
    return Abc_Var2Lit( pObjNew->Id, 0 );
}